

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void aom_smooth_v_predictor_32x64_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  unkuint9 Var25;
  undefined1 auVar26 [11];
  undefined1 auVar27 [15];
  unkuint9 Var28;
  undefined1 auVar29 [11];
  undefined1 auVar30 [15];
  unkuint9 Var31;
  undefined1 auVar32 [11];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  int left_offset;
  ulong uVar39;
  uint uVar40;
  short sVar41;
  short sVar43;
  undefined1 auVar42 [16];
  ushort uVar44;
  short sVar45;
  ushort uVar46;
  short sVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  ushort uVar51;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  undefined1 auVar52 [16];
  short sVar58;
  ushort uVar59;
  ushort uVar60;
  short sVar61;
  ushort uVar65;
  short sVar67;
  ushort uVar68;
  ushort uVar70;
  ushort uVar72;
  ushort uVar74;
  ushort uVar76;
  undefined1 auVar62 [16];
  ushort uVar66;
  ushort uVar69;
  ushort uVar71;
  ushort uVar73;
  ushort uVar75;
  ushort uVar77;
  ushort uVar78;
  ushort uVar79;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  short sVar80;
  short sVar82;
  short sVar83;
  short sVar84;
  short sVar85;
  short sVar86;
  short sVar87;
  undefined1 auVar81 [16];
  short sVar88;
  ushort uVar89;
  ushort uVar90;
  ushort uVar91;
  ushort uVar92;
  ushort uVar93;
  ushort uVar94;
  ushort uVar95;
  ushort uVar96;
  ushort uVar97;
  ushort uVar98;
  ushort uVar99;
  ushort uVar100;
  ushort uVar101;
  ushort uVar102;
  ushort uVar103;
  ushort uVar104;
  ushort uVar105;
  
  auVar42 = pshuflw(ZEXT116(left_column[0x3f]),ZEXT116(left_column[0x3f]),0);
  auVar1 = *(undefined1 (*) [16])top_row;
  auVar2 = *(undefined1 (*) [16])(top_row + 0x10);
  auVar3[0xd] = 0;
  auVar3._0_13_ = auVar1._0_13_;
  auVar3[0xe] = auVar1[7];
  auVar6[0xc] = auVar1[6];
  auVar6._0_12_ = auVar1._0_12_;
  auVar6._13_2_ = auVar3._13_2_;
  auVar9[0xb] = 0;
  auVar9._0_11_ = auVar1._0_11_;
  auVar9._12_3_ = auVar6._12_3_;
  auVar12[10] = auVar1[5];
  auVar12._0_10_ = auVar1._0_10_;
  auVar12._11_4_ = auVar9._11_4_;
  auVar15[9] = 0;
  auVar15._0_9_ = auVar1._0_9_;
  auVar15._10_5_ = auVar12._10_5_;
  auVar18[8] = auVar1[4];
  auVar18._0_8_ = auVar1._0_8_;
  auVar18._9_6_ = auVar15._9_6_;
  auVar24._7_8_ = 0;
  auVar24._0_7_ = auVar18._8_7_;
  Var25 = CONCAT81(SUB158(auVar24 << 0x40,7),auVar1[3]);
  auVar33._9_6_ = 0;
  auVar33._0_9_ = Var25;
  auVar26._1_10_ = SUB1510(auVar33 << 0x30,5);
  auVar26[0] = auVar1[2];
  auVar34._11_4_ = 0;
  auVar34._0_11_ = auVar26;
  auVar21[2] = auVar1[1];
  auVar21._0_2_ = auVar1._0_2_;
  auVar21._3_12_ = SUB1512(auVar34 << 0x20,3);
  uVar44 = auVar1._0_2_ & 0xff;
  auVar4[0xd] = 0;
  auVar4._0_13_ = auVar2._0_13_;
  auVar4[0xe] = auVar2[7];
  auVar7[0xc] = auVar2[6];
  auVar7._0_12_ = auVar2._0_12_;
  auVar7._13_2_ = auVar4._13_2_;
  auVar10[0xb] = 0;
  auVar10._0_11_ = auVar2._0_11_;
  auVar10._12_3_ = auVar7._12_3_;
  auVar13[10] = auVar2[5];
  auVar13._0_10_ = auVar2._0_10_;
  auVar13._11_4_ = auVar10._11_4_;
  auVar16[9] = 0;
  auVar16._0_9_ = auVar2._0_9_;
  auVar16._10_5_ = auVar13._10_5_;
  auVar19[8] = auVar2[4];
  auVar19._0_8_ = auVar2._0_8_;
  auVar19._9_6_ = auVar16._9_6_;
  auVar27._7_8_ = 0;
  auVar27._0_7_ = auVar19._8_7_;
  Var28 = CONCAT81(SUB158(auVar27 << 0x40,7),auVar2[3]);
  auVar35._9_6_ = 0;
  auVar35._0_9_ = Var28;
  auVar29._1_10_ = SUB1510(auVar35 << 0x30,5);
  auVar29[0] = auVar2[2];
  auVar36._11_4_ = 0;
  auVar36._0_11_ = auVar29;
  auVar22[2] = auVar2[1];
  auVar22._0_2_ = auVar2._0_2_;
  auVar22._3_12_ = SUB1512(auVar36 << 0x20,3);
  uVar46 = auVar2._0_2_ & 0xff;
  for (uVar39 = 0; uVar39 < 0x40; uVar39 = uVar39 + 0x10) {
    auVar50 = *(undefined1 (*) [16])(smooth_weights + uVar39 + 0x3c);
    auVar5[0xd] = 0;
    auVar5._0_13_ = auVar50._0_13_;
    auVar5[0xe] = auVar50[7];
    auVar8[0xc] = auVar50[6];
    auVar8._0_12_ = auVar50._0_12_;
    auVar8._13_2_ = auVar5._13_2_;
    auVar11[0xb] = 0;
    auVar11._0_11_ = auVar50._0_11_;
    auVar11._12_3_ = auVar8._12_3_;
    auVar14[10] = auVar50[5];
    auVar14._0_10_ = auVar50._0_10_;
    auVar14._11_4_ = auVar11._11_4_;
    auVar17[9] = 0;
    auVar17._0_9_ = auVar50._0_9_;
    auVar17._10_5_ = auVar14._10_5_;
    auVar20[8] = auVar50[4];
    auVar20._0_8_ = auVar50._0_8_;
    auVar20._9_6_ = auVar17._9_6_;
    auVar30._7_8_ = 0;
    auVar30._0_7_ = auVar20._8_7_;
    Var31 = CONCAT81(SUB158(auVar30 << 0x40,7),auVar50[3]);
    auVar37._9_6_ = 0;
    auVar37._0_9_ = Var31;
    auVar32._1_10_ = SUB1510(auVar37 << 0x30,5);
    auVar32[0] = auVar50[2];
    auVar38._11_4_ = 0;
    auVar38._0_11_ = auVar32;
    auVar23[2] = auVar50[1];
    auVar23._0_2_ = auVar50._0_2_;
    auVar23._3_12_ = SUB1512(auVar38 << 0x20,3);
    auVar64._0_2_ = auVar50._0_2_ & 0xff;
    auVar64._2_13_ = auVar23._2_13_;
    auVar64[0xf] = 0;
    auVar48._0_2_ = CONCAT11(0,auVar50[8]);
    auVar48[2] = auVar50[9];
    auVar48[3] = 0;
    auVar48[4] = auVar50[10];
    auVar48[5] = 0;
    auVar48[6] = auVar50[0xb];
    auVar48[7] = 0;
    auVar48[8] = auVar50[0xc];
    auVar48[9] = 0;
    auVar48[10] = auVar50[0xd];
    auVar48[0xb] = 0;
    auVar48[0xc] = auVar50[0xe];
    auVar48[0xd] = 0;
    auVar48[0xe] = auVar50[0xf];
    auVar48[0xf] = 0;
    sVar41 = auVar42._0_2_;
    auVar49._0_2_ = (0x100 - auVar64._0_2_) * sVar41;
    sVar43 = auVar42._2_2_;
    auVar49._2_2_ = (0x100 - auVar23._2_2_) * sVar43;
    auVar49._4_2_ = (0x100 - auVar32._0_2_) * sVar41;
    auVar49._6_2_ = (0x100 - (short)Var31) * sVar43;
    auVar49._8_2_ = (0x100 - auVar20._8_2_) * sVar41;
    auVar49._10_2_ = (0x100 - auVar14._10_2_) * sVar43;
    auVar49._12_2_ = (0x100 - auVar8._12_2_) * sVar41;
    auVar49._14_2_ = (0x100 - (auVar5._13_2_ >> 8)) * sVar43;
    uVar40 = 0x1000100;
    while( true ) {
      sVar45 = (short)Var25;
      uVar60 = auVar3._13_2_ >> 8;
      sVar47 = (short)Var28;
      uVar51 = auVar4._13_2_ >> 8;
      if (0xf0e0f0e < uVar40) break;
      auVar62._4_4_ = uVar40;
      auVar62._0_4_ = uVar40;
      auVar62._8_4_ = uVar40;
      auVar62._12_4_ = uVar40;
      auVar52 = pshufb(auVar64,auVar62);
      auVar81 = pshufb(auVar49,auVar62);
      sVar53 = auVar52._0_2_;
      sVar54 = auVar52._2_2_;
      sVar55 = auVar52._4_2_;
      sVar56 = auVar52._6_2_;
      sVar57 = auVar52._8_2_;
      sVar58 = auVar52._10_2_;
      sVar61 = auVar52._12_2_;
      sVar67 = auVar52._14_2_;
      sVar80 = auVar81._0_2_ + 0x80;
      sVar82 = auVar81._2_2_ + 0x80;
      sVar83 = auVar81._4_2_ + 0x80;
      sVar84 = auVar81._6_2_ + 0x80;
      sVar85 = auVar81._8_2_ + 0x80;
      sVar86 = auVar81._10_2_ + 0x80;
      sVar87 = auVar81._12_2_ + 0x80;
      sVar88 = auVar81._14_2_ + 0x80;
      uVar59 = sVar53 * uVar44 + sVar80;
      uVar65 = sVar54 * auVar21._2_2_ + sVar82;
      uVar68 = sVar55 * auVar26._0_2_ + sVar83;
      uVar70 = sVar56 * sVar45 + sVar84;
      uVar72 = sVar57 * auVar18._8_2_ + sVar85;
      uVar74 = sVar58 * auVar12._10_2_ + sVar86;
      uVar76 = sVar61 * auVar6._12_2_ + sVar87;
      uVar78 = sVar67 * uVar60 + sVar88;
      uVar60 = uVar59 >> 8;
      uVar66 = uVar65 >> 8;
      uVar69 = uVar68 >> 8;
      uVar71 = uVar70 >> 8;
      uVar73 = uVar72 >> 8;
      uVar75 = uVar74 >> 8;
      uVar77 = uVar76 >> 8;
      uVar79 = uVar78 >> 8;
      uVar90 = sVar53 * (ushort)auVar1[8] + sVar80;
      uVar92 = sVar54 * (ushort)auVar1[9] + sVar82;
      uVar94 = sVar55 * (ushort)auVar1[10] + sVar83;
      uVar96 = sVar56 * (ushort)auVar1[0xb] + sVar84;
      uVar98 = sVar57 * (ushort)auVar1[0xc] + sVar85;
      uVar100 = sVar58 * (ushort)auVar1[0xd] + sVar86;
      uVar102 = sVar61 * (ushort)auVar1[0xe] + sVar87;
      uVar104 = sVar67 * (ushort)auVar1[0xf] + sVar88;
      uVar91 = uVar90 >> 8;
      uVar93 = uVar92 >> 8;
      uVar95 = uVar94 >> 8;
      uVar97 = uVar96 >> 8;
      uVar99 = uVar98 >> 8;
      uVar101 = uVar100 >> 8;
      uVar103 = uVar102 >> 8;
      uVar105 = uVar104 >> 8;
      *dst = (uVar60 != 0) * (uVar60 < 0x100) * (char)(uVar59 >> 8) - (0xff < uVar60);
      dst[1] = (uVar66 != 0) * (uVar66 < 0x100) * (char)(uVar65 >> 8) - (0xff < uVar66);
      dst[2] = (uVar69 != 0) * (uVar69 < 0x100) * (char)(uVar68 >> 8) - (0xff < uVar69);
      dst[3] = (uVar71 != 0) * (uVar71 < 0x100) * (char)(uVar70 >> 8) - (0xff < uVar71);
      dst[4] = (uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73);
      dst[5] = (uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75);
      dst[6] = (uVar77 != 0) * (uVar77 < 0x100) * (char)(uVar76 >> 8) - (0xff < uVar77);
      dst[7] = (uVar79 != 0) * (uVar79 < 0x100) * (char)(uVar78 >> 8) - (0xff < uVar79);
      dst[8] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
      dst[9] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar93);
      dst[10] = (uVar95 != 0) * (uVar95 < 0x100) * (char)(uVar94 >> 8) - (0xff < uVar95);
      dst[0xb] = (uVar97 != 0) * (uVar97 < 0x100) * (char)(uVar96 >> 8) - (0xff < uVar97);
      dst[0xc] = (uVar99 != 0) * (uVar99 < 0x100) * (char)(uVar98 >> 8) - (0xff < uVar99);
      dst[0xd] = (uVar101 != 0) * (uVar101 < 0x100) * (char)(uVar100 >> 8) - (0xff < uVar101);
      dst[0xe] = (uVar103 != 0) * (uVar103 < 0x100) * (char)(uVar102 >> 8) - (0xff < uVar103);
      dst[0xf] = (uVar105 != 0) * (uVar105 < 0x100) * (char)(uVar104 >> 8) - (0xff < uVar105);
      uVar79 = sVar53 * uVar46 + sVar80;
      uVar91 = sVar54 * auVar22._2_2_ + sVar82;
      uVar93 = sVar55 * auVar29._0_2_ + sVar83;
      uVar95 = sVar56 * sVar47 + sVar84;
      uVar97 = sVar57 * auVar19._8_2_ + sVar85;
      uVar99 = sVar58 * auVar13._10_2_ + sVar86;
      uVar101 = sVar61 * auVar7._12_2_ + sVar87;
      uVar103 = sVar67 * uVar51 + sVar88;
      uVar90 = uVar79 >> 8;
      uVar92 = uVar91 >> 8;
      uVar94 = uVar93 >> 8;
      uVar96 = uVar95 >> 8;
      uVar98 = uVar97 >> 8;
      uVar100 = uVar99 >> 8;
      uVar102 = uVar101 >> 8;
      uVar104 = uVar103 >> 8;
      uVar60 = sVar53 * (ushort)auVar2[8] + sVar80;
      uVar59 = sVar54 * (ushort)auVar2[9] + sVar82;
      uVar66 = sVar55 * (ushort)auVar2[10] + sVar83;
      uVar69 = sVar56 * (ushort)auVar2[0xb] + sVar84;
      uVar71 = sVar57 * (ushort)auVar2[0xc] + sVar85;
      uVar73 = sVar58 * (ushort)auVar2[0xd] + sVar86;
      uVar75 = sVar61 * (ushort)auVar2[0xe] + sVar87;
      uVar77 = sVar67 * (ushort)auVar2[0xf] + sVar88;
      uVar51 = uVar60 >> 8;
      uVar65 = uVar59 >> 8;
      uVar68 = uVar66 >> 8;
      uVar70 = uVar69 >> 8;
      uVar72 = uVar71 >> 8;
      uVar74 = uVar73 >> 8;
      uVar76 = uVar75 >> 8;
      uVar78 = uVar77 >> 8;
      auVar63[1] = (uVar92 != 0) * (uVar92 < 0x100) * (char)(uVar91 >> 8) - (0xff < uVar92);
      auVar63[0] = (uVar90 != 0) * (uVar90 < 0x100) * (char)(uVar79 >> 8) - (0xff < uVar90);
      auVar63[2] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar93 >> 8) - (0xff < uVar94);
      auVar63[3] = (uVar96 != 0) * (uVar96 < 0x100) * (char)(uVar95 >> 8) - (0xff < uVar96);
      auVar63[4] = (uVar98 != 0) * (uVar98 < 0x100) * (char)(uVar97 >> 8) - (0xff < uVar98);
      auVar63[5] = (uVar100 != 0) * (uVar100 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar100);
      auVar63[6] = (uVar102 != 0) * (uVar102 < 0x100) * (char)(uVar101 >> 8) - (0xff < uVar102);
      auVar63[7] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar104);
      auVar63[8] = (uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar60 >> 8) - (0xff < uVar51);
      auVar63[9] = (uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar59 >> 8) - (0xff < uVar65);
      auVar63[10] = (uVar68 != 0) * (uVar68 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar68);
      auVar63[0xb] = (uVar70 != 0) * (uVar70 < 0x100) * (char)(uVar69 >> 8) - (0xff < uVar70);
      auVar63[0xc] = (uVar72 != 0) * (uVar72 < 0x100) * (char)(uVar71 >> 8) - (0xff < uVar72);
      auVar63[0xd] = (uVar74 != 0) * (uVar74 < 0x100) * (char)(uVar73 >> 8) - (0xff < uVar74);
      auVar63[0xe] = (uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar76);
      auVar63[0xf] = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
      *(undefined1 (*) [16])(dst + 0x10) = auVar63;
      dst = dst + stride;
      uVar40 = uVar40 + 0x2020202;
    }
    auVar52._0_2_ = (0x100 - auVar48._0_2_) * sVar41;
    auVar52._2_2_ = (0x100 - (ushort)auVar50[9]) * sVar43;
    auVar52._4_2_ = (0x100 - (ushort)auVar50[10]) * sVar41;
    auVar52._6_2_ = (0x100 - (ushort)auVar50[0xb]) * sVar43;
    auVar52._8_2_ = (0x100 - (ushort)auVar50[0xc]) * sVar41;
    auVar52._10_2_ = (0x100 - (ushort)auVar50[0xd]) * sVar43;
    auVar52._12_2_ = (0x100 - (ushort)auVar50[0xe]) * sVar41;
    auVar52._14_2_ = (0x100 - (ushort)auVar50[0xf]) * sVar43;
    for (uVar40 = 0x1000100; uVar40 < 0xf0e0f0f; uVar40 = uVar40 + 0x2020202) {
      auVar81._4_4_ = uVar40;
      auVar81._0_4_ = uVar40;
      auVar81._8_4_ = uVar40;
      auVar81._12_4_ = uVar40;
      auVar50 = pshufb(auVar48,auVar81);
      auVar64 = pshufb(auVar52,auVar81);
      sVar41 = auVar50._0_2_;
      sVar43 = auVar50._2_2_;
      sVar53 = auVar50._4_2_;
      sVar54 = auVar50._6_2_;
      sVar55 = auVar50._8_2_;
      sVar56 = auVar50._10_2_;
      sVar57 = auVar50._12_2_;
      sVar58 = auVar50._14_2_;
      sVar61 = auVar64._0_2_ + 0x80;
      sVar67 = auVar64._2_2_ + 0x80;
      sVar80 = auVar64._4_2_ + 0x80;
      sVar82 = auVar64._6_2_ + 0x80;
      sVar83 = auVar64._8_2_ + 0x80;
      sVar84 = auVar64._10_2_ + 0x80;
      sVar85 = auVar64._12_2_ + 0x80;
      sVar86 = auVar64._14_2_ + 0x80;
      uVar59 = sVar41 * uVar44 + sVar61;
      uVar66 = sVar43 * auVar21._2_2_ + sVar67;
      uVar69 = sVar53 * auVar26._0_2_ + sVar80;
      uVar71 = sVar54 * sVar45 + sVar82;
      uVar73 = sVar55 * auVar18._8_2_ + sVar83;
      uVar75 = sVar56 * auVar12._10_2_ + sVar84;
      uVar77 = sVar57 * auVar6._12_2_ + sVar85;
      uVar79 = sVar58 * uVar60 + sVar86;
      uVar65 = uVar59 >> 8;
      uVar68 = uVar66 >> 8;
      uVar70 = uVar69 >> 8;
      uVar72 = uVar71 >> 8;
      uVar74 = uVar73 >> 8;
      uVar76 = uVar75 >> 8;
      uVar78 = uVar77 >> 8;
      uVar90 = uVar79 >> 8;
      uVar91 = sVar41 * (ushort)auVar1[8] + sVar61;
      uVar93 = sVar43 * (ushort)auVar1[9] + sVar67;
      uVar95 = sVar53 * (ushort)auVar1[10] + sVar80;
      uVar97 = sVar54 * (ushort)auVar1[0xb] + sVar82;
      uVar99 = sVar55 * (ushort)auVar1[0xc] + sVar83;
      uVar101 = sVar56 * (ushort)auVar1[0xd] + sVar84;
      uVar103 = sVar57 * (ushort)auVar1[0xe] + sVar85;
      uVar105 = sVar58 * (ushort)auVar1[0xf] + sVar86;
      uVar92 = uVar91 >> 8;
      uVar94 = uVar93 >> 8;
      uVar96 = uVar95 >> 8;
      uVar98 = uVar97 >> 8;
      uVar100 = uVar99 >> 8;
      uVar102 = uVar101 >> 8;
      uVar104 = uVar103 >> 8;
      uVar89 = uVar105 >> 8;
      *dst = (uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar59 >> 8) - (0xff < uVar65);
      dst[1] = (uVar68 != 0) * (uVar68 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar68);
      dst[2] = (uVar70 != 0) * (uVar70 < 0x100) * (char)(uVar69 >> 8) - (0xff < uVar70);
      dst[3] = (uVar72 != 0) * (uVar72 < 0x100) * (char)(uVar71 >> 8) - (0xff < uVar72);
      dst[4] = (uVar74 != 0) * (uVar74 < 0x100) * (char)(uVar73 >> 8) - (0xff < uVar74);
      dst[5] = (uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar76);
      dst[6] = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
      dst[7] = (uVar90 != 0) * (uVar90 < 0x100) * (char)(uVar79 >> 8) - (0xff < uVar90);
      dst[8] = (uVar92 != 0) * (uVar92 < 0x100) * (char)(uVar91 >> 8) - (0xff < uVar92);
      dst[9] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar93 >> 8) - (0xff < uVar94);
      dst[10] = (uVar96 != 0) * (uVar96 < 0x100) * (char)(uVar95 >> 8) - (0xff < uVar96);
      dst[0xb] = (uVar98 != 0) * (uVar98 < 0x100) * (char)(uVar97 >> 8) - (0xff < uVar98);
      dst[0xc] = (uVar100 != 0) * (uVar100 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar100);
      dst[0xd] = (uVar102 != 0) * (uVar102 < 0x100) * (char)(uVar101 >> 8) - (0xff < uVar102);
      dst[0xe] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar104);
      dst[0xf] = (uVar89 != 0) * (uVar89 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar89);
      uVar91 = sVar41 * uVar46 + sVar61;
      uVar93 = sVar43 * auVar22._2_2_ + sVar67;
      uVar95 = sVar53 * auVar29._0_2_ + sVar80;
      uVar97 = sVar54 * sVar47 + sVar82;
      uVar99 = sVar55 * auVar19._8_2_ + sVar83;
      uVar101 = sVar56 * auVar13._10_2_ + sVar84;
      uVar103 = sVar57 * auVar7._12_2_ + sVar85;
      uVar105 = sVar58 * uVar51 + sVar86;
      uVar92 = uVar91 >> 8;
      uVar94 = uVar93 >> 8;
      uVar96 = uVar95 >> 8;
      uVar98 = uVar97 >> 8;
      uVar100 = uVar99 >> 8;
      uVar102 = uVar101 >> 8;
      uVar104 = uVar103 >> 8;
      uVar89 = uVar105 >> 8;
      uVar59 = sVar41 * (ushort)auVar2[8] + sVar61;
      uVar66 = sVar43 * (ushort)auVar2[9] + sVar67;
      uVar69 = sVar53 * (ushort)auVar2[10] + sVar80;
      uVar71 = sVar54 * (ushort)auVar2[0xb] + sVar82;
      uVar73 = sVar55 * (ushort)auVar2[0xc] + sVar83;
      uVar75 = sVar56 * (ushort)auVar2[0xd] + sVar84;
      uVar77 = sVar57 * (ushort)auVar2[0xe] + sVar85;
      uVar79 = sVar58 * (ushort)auVar2[0xf] + sVar86;
      uVar65 = uVar59 >> 8;
      uVar68 = uVar66 >> 8;
      uVar70 = uVar69 >> 8;
      uVar72 = uVar71 >> 8;
      uVar74 = uVar73 >> 8;
      uVar76 = uVar75 >> 8;
      uVar78 = uVar77 >> 8;
      uVar90 = uVar79 >> 8;
      auVar50[1] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar93 >> 8) - (0xff < uVar94);
      auVar50[0] = (uVar92 != 0) * (uVar92 < 0x100) * (char)(uVar91 >> 8) - (0xff < uVar92);
      auVar50[2] = (uVar96 != 0) * (uVar96 < 0x100) * (char)(uVar95 >> 8) - (0xff < uVar96);
      auVar50[3] = (uVar98 != 0) * (uVar98 < 0x100) * (char)(uVar97 >> 8) - (0xff < uVar98);
      auVar50[4] = (uVar100 != 0) * (uVar100 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar100);
      auVar50[5] = (uVar102 != 0) * (uVar102 < 0x100) * (char)(uVar101 >> 8) - (0xff < uVar102);
      auVar50[6] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar104);
      auVar50[7] = (uVar89 != 0) * (uVar89 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar89);
      auVar50[8] = (uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar59 >> 8) - (0xff < uVar65);
      auVar50[9] = (uVar68 != 0) * (uVar68 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar68);
      auVar50[10] = (uVar70 != 0) * (uVar70 < 0x100) * (char)(uVar69 >> 8) - (0xff < uVar70);
      auVar50[0xb] = (uVar72 != 0) * (uVar72 < 0x100) * (char)(uVar71 >> 8) - (0xff < uVar72);
      auVar50[0xc] = (uVar74 != 0) * (uVar74 < 0x100) * (char)(uVar73 >> 8) - (0xff < uVar74);
      auVar50[0xd] = (uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar76);
      auVar50[0xe] = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
      auVar50[0xf] = (uVar90 != 0) * (uVar90 < 0x100) * (char)(uVar79 >> 8) - (0xff < uVar90);
      *(undefined1 (*) [16])(dst + 0x10) = auVar50;
      dst = dst + stride;
    }
  }
  return;
}

Assistant:

void aom_smooth_v_predictor_32x64_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i bottom_left = _mm_set1_epi16(left_column[63]);
  const __m128i top_lo = LoadUnaligned16(top_row);
  const __m128i top_hi = LoadUnaligned16(top_row + 16);
  const __m128i top1 = cvtepu8_epi16(top_lo);
  const __m128i top2 = _mm_unpackhi_epi8(top_lo, zero);
  const __m128i top3 = cvtepu8_epi16(top_hi);
  const __m128i top4 = _mm_unpackhi_epi8(top_hi, zero);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  const uint8_t *weights_base_ptr = smooth_weights + 60;
  for (int left_offset = 0; left_offset < 64; left_offset += 16) {
    const __m128i weights = LoadUnaligned16(weights_base_ptr + left_offset);
    const __m128i weights_lo = cvtepu8_epi16(weights);
    const __m128i weights_hi = _mm_unpackhi_epi8(weights, zero);
    const __m128i inverted_weights_lo = _mm_sub_epi16(scale, weights_lo);
    const __m128i inverted_weights_hi = _mm_sub_epi16(scale, weights_hi);
    const __m128i scaled_bottom_left_lo =
        _mm_mullo_epi16(inverted_weights_lo, bottom_left);
    const __m128i scaled_bottom_left_hi =
        _mm_mullo_epi16(inverted_weights_hi, bottom_left);

    for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
      const __m128i y_select = _mm_set1_epi32(y_mask);
      const __m128i weights_y = _mm_shuffle_epi8(weights_lo, y_select);
      const __m128i scaled_bottom_left_y =
          _mm_shuffle_epi8(scaled_bottom_left_lo, y_select);
      write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                     scaled_bottom_left_y, scaled_bottom_left_y,
                                     round);
      write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                     scaled_bottom_left_y, scaled_bottom_left_y,
                                     round);
      dst += stride;
    }
    for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
      const __m128i y_select = _mm_set1_epi32(y_mask);
      const __m128i weights_y = _mm_shuffle_epi8(weights_hi, y_select);
      const __m128i scaled_bottom_left_y =
          _mm_shuffle_epi8(scaled_bottom_left_hi, y_select);
      write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                     scaled_bottom_left_y, scaled_bottom_left_y,
                                     round);
      write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                     scaled_bottom_left_y, scaled_bottom_left_y,
                                     round);
      dst += stride;
    }
  }
}